

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void ctemplate::anon_unknown_14::WriteOneHeaderEntry
               (string *outstring,string *variable,string *full_pathname)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  char cVar7;
  size_type i;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string filename;
  
  Mutex::Lock((Mutex *)&(anonymous_namespace)::g_header_mutex);
  if ((anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::vars_seen_abi_cxx11_);
    if (iVar2 != 0) {
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_buckets =
           &(anonymous_namespace)::
            WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::vars_seen_abi_cxx11_._M_h._M_single_bucket;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_bucket_count = 1;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_element_count = 0;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_rehash_policy._M_next_resize = 0;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   ::~unordered_map,
                   &(anonymous_namespace)::
                    WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::vars_seen_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                           ::vars_seen_abi_cxx11_);
    }
  }
  if ((anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::current_file_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::current_file_abi_cxx11_);
    if (iVar2 != 0) {
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::current_file_abi_cxx11_._M_dataplus._M_p =
           (pointer)&(anonymous_namespace)::
                     WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::current_file_abi_cxx11_.field_2;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::current_file_abi_cxx11_._M_string_length = 0;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::current_file_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &(anonymous_namespace)::
                    WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::current_file_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                           ::current_file_abi_cxx11_);
    }
  }
  if ((anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::prefix_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::prefix_abi_cxx11_);
    if (iVar2 != 0) {
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::prefix_abi_cxx11_._M_dataplus._M_p =
           (pointer)&(anonymous_namespace)::
                     WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::prefix_abi_cxx11_.field_2;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::prefix_abi_cxx11_._M_string_length = 0;
      (anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::prefix_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &(anonymous_namespace)::
                    WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::prefix_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                           ::prefix_abi_cxx11_);
    }
  }
  bVar1 = std::operator!=(full_pathname,
                          &(anonymous_namespace)::
                           WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                           ::current_file_abi_cxx11_);
  if (bVar1) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::vars_seen_abi_cxx11_._M_h);
    std::__cxx11::string::_M_assign
              ((string *)
               &(anonymous_namespace)::
                WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                ::current_file_abi_cxx11_);
    Basename(&filename,full_pathname);
    std::__cxx11::string::assign
              ((char *)&(anonymous_namespace)::
                        WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::prefix_abi_cxx11_);
    bVar1 = true;
    uVar8 = 0;
    do {
      if ((filename._M_string_length <= uVar8) ||
         (cVar7 = filename._M_dataplus._M_p[uVar8], cVar7 == '.')) goto LAB_00120057;
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&filename);
        bVar1 = std::operator==(&local_1c8,"post");
        std::__cxx11::string::~string((string *)&local_1c8);
        if (bVar1) goto LAB_00120057;
        std::operator+(&local_1c8,
                       &(anonymous_namespace)::
                        WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::prefix_abi_cxx11_,filename._M_dataplus._M_p[uVar8]);
        std::__cxx11::string::operator=
                  ((string *)
                   &(anonymous_namespace)::
                    WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::prefix_abi_cxx11_,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        cVar7 = filename._M_dataplus._M_p[uVar8];
      }
      bVar1 = cVar7 == '_';
      uVar8 = uVar8 + 1;
    } while( true );
  }
LAB_0012009e:
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(anonymous_namespace)::
                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::vars_seen_abi_cxx11_._M_h,variable);
  if (sVar3 == 0) {
    bVar1 = std::operator==(variable,"__{{MAIN}}__");
    if (!bVar1) {
      lVar4 = std::__cxx11::string::find((char *)variable,0x135b34);
      if (lVar4 != 0) {
        filename._M_dataplus._M_p = (variable->_M_dataplus)._M_p;
        filename._M_string_length = variable->_M_string_length;
        filename.field_2._M_local_buf[0] = '\0';
        filename.field_2._8_8_ = 0;
        TemplateString::GetGlobalId((TemplateString *)&filename);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
        poVar5 = std::operator<<((ostream *)&filename,"static const ");
        poVar5 = std::operator<<(poVar5,"ctemplate");
        poVar5 = std::operator<<(poVar5,"::StaticTemplateString ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &(anonymous_namespace)::
                                         WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::prefix_abi_cxx11_);
        poVar5 = std::operator<<(poVar5,(string *)variable);
        poVar5 = std::operator<<(poVar5," = STS_INIT_WITH_HASH(");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &(anonymous_namespace)::
                                         WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::prefix_abi_cxx11_);
        poVar5 = std::operator<<(poVar5,(string *)variable);
        poVar5 = std::operator<<(poVar5,", \"");
        poVar5 = std::operator<<(poVar5,(string *)variable);
        poVar5 = std::operator<<(poVar5,"\", ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,"ULL);\n");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)outstring);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
      }
    }
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(anonymous_namespace)::
                              WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                              ::vars_seen_abi_cxx11_,variable);
    *pmVar6 = true;
  }
  Mutex::Unlock((Mutex *)&(anonymous_namespace)::g_header_mutex);
  return;
LAB_00120057:
  std::operator+(&local_1c8,
                 &(anonymous_namespace)::
                  WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                  ::prefix_abi_cxx11_,"_");
  std::__cxx11::string::operator=
            ((string *)
             &(anonymous_namespace)::
              WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
              ::prefix_abi_cxx11_,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&filename);
  goto LAB_0012009e;
}

Assistant:

LOCKS_EXCLUDED(g_header_mutex) {
  MutexLock ml(&g_header_mutex);

  // we use hash_map instead of hash_set just to keep the stl size down
  static hash_map<string, bool, StringHash> vars_seen
      GUARDED_BY(g_header_mutex);
  static string current_file GUARDED_BY(g_header_mutex);
  static string prefix GUARDED_BY(g_header_mutex);

  if (full_pathname != current_file) {
    // changed files so re-initialize the static variables
    vars_seen.clear();
    current_file = full_pathname;

    // remove the path before the filename
    string filename(Basename(full_pathname));

    prefix = "k";
    bool take_next = true;

    for (string::size_type i = 0; i < filename.length(); i++) {
      if (filename[i] == '.') {
        // stop when we find the dot
        break;
      }
      if (take_next) {
        if (filename.substr(i, 4) == "post") {
          // stop before we process post...
          break;
        }
        prefix = prefix + filename[i];
        take_next = false;
      }
      if (filename[i] == '_') {
        take_next = true;
      }
    }
    prefix = prefix + "_";
  }

  // print out the variable, but only if we haven't seen it before.
  if (!vars_seen.count(variable)) {
    if (variable == kMainSectionName || variable.find("BI_") == 0) {
      // We don't want to write entries for __MAIN__ or the built-ins
    } else {
      const TemplateId id = GlobalIdForSTS_INIT(TemplateString(variable));
      std::ostringstream outstream;
      outstream << "static const "
                << AS_STR(GOOGLE_NAMESPACE) << "::StaticTemplateString "
                << prefix << variable << " = STS_INIT_WITH_HASH("
                << prefix << variable << ", \"" << variable << "\", "
                << id << "ULL);\n";
      outstring->append(outstream.str());
    }
    vars_seen[variable] = true;
  }
}